

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realdata_unit.c
# Opt level: O2

_Bool compare_wide_unions(roaring_bitmap_t **rnorun,roaring_bitmap_t **rruns,size_t count)

{
  _Bool _Var1;
  roaring_bitmap_t *bitmap1;
  roaring_bitmap_t *bitmap2;
  roaring_bitmap_t *prVar2;
  roaring_bitmap_t *prVar3;
  roaring_bitmap_t *r1;
  roaring_bitmap_t *r2;
  uint32_t number;
  char *__s;
  long lVar4;
  
  bitmap1 = roaring_bitmap_or_many(count,rnorun);
  bitmap2 = roaring_bitmap_or_many(count,rruns);
  _Var1 = slow_bitmap_equals(bitmap1,bitmap2);
  if (_Var1) {
    _Var1 = roaring_bitmap_equals(bitmap1,bitmap2);
    _assert_true((ulong)_Var1,"roaring_bitmap_equals(tempornorun, temporruns)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/realdata_unit.c"
                 ,0x28b);
    number = (uint32_t)count;
    prVar2 = roaring_bitmap_or_many_heap(number,rnorun);
    prVar3 = roaring_bitmap_or_many_heap(number,rruns);
    _Var1 = roaring_bitmap_equals(bitmap1,prVar2);
    _assert_true((ulong)_Var1,"roaring_bitmap_equals(tempornorun, tempornorunheap)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/realdata_unit.c"
                 ,0x294);
    _Var1 = roaring_bitmap_equals(bitmap2,prVar3);
    _assert_true((ulong)_Var1,"roaring_bitmap_equals(temporruns, temporrunsheap)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/realdata_unit.c"
                 ,0x295);
    roaring_bitmap_free(prVar2);
    roaring_bitmap_free(prVar3);
    prVar2 = *rnorun;
    prVar3 = *rruns;
    if (count != 1) {
      _Var1 = roaring_bitmap_equals(prVar2,prVar3);
      _assert_true((ulong)_Var1,"roaring_bitmap_equals(rnorun[0], rruns[0])",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/realdata_unit.c"
                   ,0x29f);
      _Var1 = roaring_bitmap_equals(rnorun[1],rruns[1]);
      _assert_true((ulong)_Var1,"roaring_bitmap_equals(rnorun[1], rruns[1])",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/realdata_unit.c"
                   ,0x2a0);
      prVar2 = roaring_bitmap_or(*rnorun,rnorun[1]);
      prVar3 = roaring_bitmap_or(*rruns,rruns[1]);
      _Var1 = roaring_bitmap_equals(prVar2,prVar3);
      _assert_true((ulong)_Var1,"roaring_bitmap_equals(longtempornorun, longtemporruns)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/realdata_unit.c"
                   ,0x2a3);
      for (lVar4 = 2; lVar4 < (int)number; lVar4 = lVar4 + 1) {
        _Var1 = roaring_bitmap_equals(rnorun[lVar4],rruns[lVar4]);
        _assert_true((ulong)_Var1,"roaring_bitmap_equals(rnorun[i], rruns[i])",
                     "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/realdata_unit.c"
                     ,0x2a5);
        _Var1 = roaring_bitmap_equals(prVar2,prVar3);
        _assert_true((ulong)_Var1,"roaring_bitmap_equals(longtempornorun, longtemporruns)",
                     "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/realdata_unit.c"
                     ,0x2a6);
        r1 = roaring_bitmap_or(rnorun[lVar4],prVar2);
        r2 = roaring_bitmap_or(rruns[lVar4],prVar3);
        _Var1 = roaring_bitmap_equals(r1,r2);
        _assert_true((ulong)_Var1,"roaring_bitmap_equals(t1, t2)",
                     "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/realdata_unit.c"
                     ,0x2ab);
        roaring_bitmap_free(prVar2);
        roaring_bitmap_free(prVar3);
        _Var1 = roaring_bitmap_equals(r1,r2);
        _assert_true((ulong)_Var1,"roaring_bitmap_equals(longtempornorun, longtemporruns)",
                     "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/realdata_unit.c"
                     ,0x2b0);
        prVar2 = r1;
        prVar3 = r2;
      }
    }
    _Var1 = slow_bitmap_equals(prVar2,bitmap1);
    if (_Var1) {
      _Var1 = slow_bitmap_equals(bitmap2,prVar3);
      if (_Var1) {
        roaring_bitmap_free(bitmap1);
        roaring_bitmap_free(bitmap2);
        roaring_bitmap_free(prVar2);
        roaring_bitmap_free(prVar3);
        return true;
      }
      __s = "[compare_wide_unions] Unions don\'t agree! (runs) ";
    }
    else {
      __s = "[compare_wide_unions] Unions don\'t agree! (regular) ";
    }
  }
  else {
    __s = "[compare_wide_unions] Unions don\'t agree! (fast run-norun) ";
  }
  puts(__s);
  return false;
}

Assistant:

bool compare_wide_unions(roaring_bitmap_t **rnorun, roaring_bitmap_t **rruns,
                         size_t count) {
    roaring_bitmap_t *tempornorun =
        roaring_bitmap_or_many(count, (const roaring_bitmap_t **)rnorun);
    roaring_bitmap_t *temporruns =
        roaring_bitmap_or_many(count, (const roaring_bitmap_t **)rruns);
    if (!slow_bitmap_equals(tempornorun, temporruns)) {
        printf("[compare_wide_unions] Unions don't agree! (fast run-norun) \n");
        return false;
    }
    assert_true(roaring_bitmap_equals(tempornorun, temporruns));

    roaring_bitmap_t *tempornorunheap =
        roaring_bitmap_or_many_heap(count, (const roaring_bitmap_t **)rnorun);
    roaring_bitmap_t *temporrunsheap =
        roaring_bitmap_or_many_heap(count, (const roaring_bitmap_t **)rruns);
    // assert_true(slow_bitmap_equals(tempornorun, tempornorunheap));
    // assert_true(slow_bitmap_equals(temporruns,temporrunsheap));

    assert_true(roaring_bitmap_equals(tempornorun, tempornorunheap));
    assert_true(roaring_bitmap_equals(temporruns, temporrunsheap));
    roaring_bitmap_free(tempornorunheap);
    roaring_bitmap_free(temporrunsheap);

    roaring_bitmap_t *longtempornorun;
    roaring_bitmap_t *longtemporruns;
    if (count == 1) {
        longtempornorun = rnorun[0];
        longtemporruns = rruns[0];
    } else {
        assert_true(roaring_bitmap_equals(rnorun[0], rruns[0]));
        assert_true(roaring_bitmap_equals(rnorun[1], rruns[1]));
        longtempornorun = roaring_bitmap_or(rnorun[0], rnorun[1]);
        longtemporruns = roaring_bitmap_or(rruns[0], rruns[1]);
        assert_true(roaring_bitmap_equals(longtempornorun, longtemporruns));
        for (int i = 2; i < (int)count; ++i) {
            assert_true(roaring_bitmap_equals(rnorun[i], rruns[i]));
            assert_true(roaring_bitmap_equals(longtempornorun, longtemporruns));

            roaring_bitmap_t *t1 =
                roaring_bitmap_or(rnorun[i], longtempornorun);
            roaring_bitmap_t *t2 = roaring_bitmap_or(rruns[i], longtemporruns);
            assert_true(roaring_bitmap_equals(t1, t2));
            roaring_bitmap_free(longtempornorun);
            longtempornorun = t1;
            roaring_bitmap_free(longtemporruns);
            longtemporruns = t2;
            assert_true(roaring_bitmap_equals(longtempornorun, longtemporruns));
        }
    }
    if (!slow_bitmap_equals(longtempornorun, tempornorun)) {
        printf("[compare_wide_unions] Unions don't agree! (regular) \n");
        return false;
    }
    if (!slow_bitmap_equals(temporruns, longtemporruns)) {
        printf("[compare_wide_unions] Unions don't agree! (runs) \n");
        return false;
    }
    roaring_bitmap_free(tempornorun);
    roaring_bitmap_free(temporruns);

    roaring_bitmap_free(longtempornorun);
    roaring_bitmap_free(longtemporruns);

    return true;
}